

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_by_name.hpp
# Opt level: O1

void __thiscall
duckdb::UnionByReaderTask<duckdb::ParquetMultiFileInfo,_duckdb::ParquetOptions>::~UnionByReaderTask
          (UnionByReaderTask<duckdb::ParquetMultiFileInfo,_duckdb::ParquetOptions> *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  p_Var2 = (this->super_BaseExecutorTask).super_Task.super_enable_shared_from_this<duckdb::Task>.
           __weak_this_.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  operator_delete(this);
  return;
}

Assistant:

UnionByReaderTask(TaskExecutor &executor, ClientContext &context, const OpenFileInfo &file, idx_t file_idx,
	                  vector<shared_ptr<BaseUnionData>> &readers, OPTIONS_TYPE &options, MultiFileOptions &file_options)
	    : BaseExecutorTask(executor), context(context), file(file), file_idx(file_idx), readers(readers),
	      options(options), file_options(file_options) {
	}